

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::Mutex::ForgetDeadlockInfo(Mutex *this)

{
  OnDeadlockCycle OVar1;
  Mutex *this_local;
  
  OVar1 = std::atomic<absl::OnDeadlockCycle>::load
                    ((atomic<absl::OnDeadlockCycle> *)
                     &(anonymous_namespace)::synch_deadlock_detection,acquire);
  if (OVar1 != kIgnore) {
    base_internal::SpinLock::Lock((SpinLock *)&deadlock_graph_mu);
    if (deadlock_graph != (GraphCycles *)0x0) {
      synchronization_internal::GraphCycles::RemoveNode(deadlock_graph,this);
    }
    base_internal::SpinLock::Unlock((SpinLock *)&deadlock_graph_mu);
  }
  return;
}

Assistant:

void Mutex::ForgetDeadlockInfo() {
  if (kDebugMode && synch_deadlock_detection.load(std::memory_order_acquire) !=
                        OnDeadlockCycle::kIgnore) {
    deadlock_graph_mu.Lock();
    if (deadlock_graph != nullptr) {
      deadlock_graph->RemoveNode(this);
    }
    deadlock_graph_mu.Unlock();
  }
}